

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O3

bool ConvertBits<5,8,false,(anonymous_namespace)::DecodeDestination(std::__cxx11::string_const&,CChainParams_const&,std::__cxx11::string&,std::vector<int,std::allocator<int>>*)::__0,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,(anonymous_namespace)::IntIdentity>
               (vector<unsigned_char,std::allocator<unsigned_char>> *outfn,byte *it,byte *end)

{
  iterator __position;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  uchar local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (it == end) {
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    uVar1 = 0;
    do {
      uVar2 = (ulong)(((uint)uVar2 & 0x7f) << 5) | (ulong)*it;
      uVar3 = uVar1 + 5;
      bVar4 = 2 < uVar1;
      uVar1 = uVar3;
      if (bVar4) {
        do {
          uVar3 = uVar3 - 8;
          local_39 = (uchar)(uVar2 >> ((byte)uVar3 & 0x3f));
          __position._M_current = *(uchar **)(outfn + 8);
          if (__position._M_current == *(uchar **)(outfn + 0x10)) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>(outfn,__position,&local_39);
          }
          else {
            *__position._M_current = local_39;
            *(long *)(outfn + 8) = *(long *)(outfn + 8) + 1;
          }
          uVar1 = uVar3;
        } while (7 < uVar3);
      }
      it = it + 1;
    } while (it != end);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar1 < 5 && ((uint)uVar2 & (uint)(0xfeL >> (8U - (char)uVar1 & 0x3f))) == 0;
}

Assistant:

bool ConvertBits(O outfn, It it, It end, I infn = {}) {
    size_t acc = 0;
    size_t bits = 0;
    constexpr size_t maxv = (1 << tobits) - 1;
    constexpr size_t max_acc = (1 << (frombits + tobits - 1)) - 1;
    while (it != end) {
        int v = infn(*it);
        if (v < 0) return false;
        acc = ((acc << frombits) | v) & max_acc;
        bits += frombits;
        while (bits >= tobits) {
            bits -= tobits;
            outfn((acc >> bits) & maxv);
        }
        ++it;
    }
    if (pad) {
        if (bits) outfn((acc << (tobits - bits)) & maxv);
    } else if (bits >= frombits || ((acc << (tobits - bits)) & maxv)) {
        return false;
    }
    return true;
}